

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamDataDownloadBuffer
          (QNetworkReplyImplPrivate *this,qint64 bytesReceived,qint64 bytesTotal)

{
  QNetworkReplyImpl *_t2;
  ulong uVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  QNetworkReplyImplPrivate *in_RDI;
  QNetworkReplyImplPrivate *unaff_retaddr;
  QNetworkReplyImpl *q;
  
  _t2 = q_func(in_RDI);
  uVar1 = QIODevice::isOpen();
  if ((uVar1 & 1) != 0) {
    if (((in_RDI->cacheEnabled & 1U) != 0) && (in_RDI->cacheSaveDevice == (QIODevice *)0x0)) {
      initCacheSaveDevice(unaff_retaddr);
    }
    if ((in_RDI->cacheSaveDevice != (QIODevice *)0x0) && (in_RSI == in_RDX)) {
      QIODevice::write((char *)in_RDI->cacheSaveDevice,(longlong)in_RDI->downloadBuffer);
    }
    in_RDI->bytesDownloaded = in_RSI;
    in_RDI->downloadBufferCurrentSize = in_RSI;
    if (0 < in_RDI->bytesDownloaded) {
      QIODevice::readyRead();
    }
    uVar1 = QElapsedTimer::isValid();
    if (((uVar1 & 1) != 0) && (lVar2 = QElapsedTimer::elapsed(), 99 < lVar2)) {
      QElapsedTimer::start();
      QNetworkReply::downloadProgress((QNetworkReply *)in_RDI,in_RDX,(qint64)_t2);
    }
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamDataDownloadBuffer(qint64 bytesReceived, qint64 bytesTotal)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    if (cacheEnabled && !cacheSaveDevice)
        initCacheSaveDevice();

    if (cacheSaveDevice && bytesReceived == bytesTotal) {
        // Write everything in one go if we use a download buffer. might be more performant.
        cacheSaveDevice->write(downloadBuffer, bytesTotal);
    }

    bytesDownloaded = bytesReceived;

    downloadBufferCurrentSize = bytesReceived;

    // Only emit readyRead when actual data is there
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (bytesDownloaded > 0)
        emit q->readyRead();
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, bytesTotal);
    }
}